

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyusdz.cc
# Opt level: O0

bool tinyusdz::IsUSD(string *filename,string *detected_format)

{
  bool bVar1;
  string *detected_format_local;
  string *filename_local;
  
  bVar1 = IsUSDA(filename);
  if (bVar1) {
    if (detected_format != (string *)0x0) {
      ::std::__cxx11::string::operator=((string *)detected_format,"usda");
    }
    filename_local._7_1_ = true;
  }
  else {
    bVar1 = IsUSDC(filename);
    if (bVar1) {
      if (detected_format != (string *)0x0) {
        ::std::__cxx11::string::operator=((string *)detected_format,"usdc");
      }
      filename_local._7_1_ = true;
    }
    else {
      bVar1 = IsUSDZ(filename);
      if (bVar1) {
        if (detected_format != (string *)0x0) {
          ::std::__cxx11::string::operator=((string *)detected_format,"usdz");
        }
        filename_local._7_1_ = true;
      }
      else {
        filename_local._7_1_ = false;
      }
    }
  }
  return filename_local._7_1_;
}

Assistant:

bool IsUSD(const std::string &filename, std::string *detected_format) {
  if (IsUSDA(filename)) {
    if (detected_format) {
      (*detected_format) = "usda";
    }
    return true;
  }

  if (IsUSDC(filename)) {
    if (detected_format) {
      (*detected_format) = "usdc";
    }
    return true;
  }

  if (IsUSDZ(filename)) {
    if (detected_format) {
      (*detected_format) = "usdz";
    }
    return true;
  }

  return false;
}